

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree-dense-points.cpp
# Opt level: O2

vector<PointT,_std::allocator<PointT>_> *
read_csv(vector<PointT,_std::allocator<PointT>_> *__return_storage_ptr__,char *filename)

{
  char *__nptr;
  float *pfVar1;
  float fVar2;
  PointT p;
  ifstream ifs;
  byte abStack_320 [488];
  char line [256];
  
  (__return_storage_ptr__->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&ifs,filename,_S_in);
  while ((abStack_320[*(long *)(_ifs + -0x18)] & 2) == 0) {
    std::istream::getline((char *)&ifs,(long)line);
    __nptr = strtok(line,",");
    pfVar1 = p.coords;
    while (__nptr != (char *)0x0) {
      fVar2 = strtof(__nptr,(char **)0x0);
      *pfVar1 = fVar2;
      __nptr = strtok((char *)0x0,",");
      pfVar1 = pfVar1 + 1;
    }
    std::vector<PointT,_std::allocator<PointT>_>::push_back(__return_storage_ptr__,&p);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::vector<PointT> read_csv(const char *filename)
{
  std::vector<PointT> points;
  std::ifstream ifs(filename);

  char line[256];
  while (!ifs.eof())
  {
    ifs.getline(line, 256);
    PointT p;
    char* token = strtok(line, ",");
    int i = 0;
    while (token != nullptr)
    {
      p.coords[i++] = std::strtof(token, nullptr);
      token = strtok(nullptr, ",");
    }
    points.push_back(p);
  }

  ifs.close();
  return points;
}